

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

_Bool ssh_ntru_server_getkey(ecdh_key *dh,ptrlen remoteKey,BinarySink *bs)

{
  ecdh_keyalg *plaintext;
  BinarySink *pBVar1;
  uint8_t val;
  ecdh_key *peVar2;
  uint16_t *pubkey_00;
  uint16_t *ciphertext_00;
  strbuf *sb;
  mp_int *x;
  ptrlen pVar3;
  ptrlen ciphertext_01;
  ptrlen confirmation_hash;
  uint local_154;
  uint i;
  mp_int *curvekey;
  undefined1 local_138 [8];
  BinarySource src_1 [1];
  _Bool ok;
  strbuf *otherkey;
  uint16_t *ciphertext;
  uint8_t hashdata [64];
  ssh_hash *h;
  ptrlen curve25519_remoteKey;
  uint16_t *pubkey;
  BinarySource src [1];
  ntru_server_key *nk;
  BinarySink *bs_local;
  ecdh_key *dh_local;
  ptrlen remoteKey_local;
  
  peVar2 = dh + -4;
  BinarySource_INIT__((BinarySource *)&pubkey,remoteKey);
  pubkey_00 = (uint16_t *)safemalloc(0x2f9,2,0);
  ntru_decode_pubkey(pubkey_00,0x2f9,0x11ef,(BinarySource *)&pubkey);
  pVar3 = BinarySource_get_data((BinarySource *)src[0]._24_8_,0x20);
  if ((*(int *)(src[0]._24_8_ + 0x18) == 0) &&
     (*(long *)(src[0]._24_8_ + 0x10) == *(long *)(src[0]._24_8_ + 8))) {
    hashdata._56_8_ = ssh_hash_new(&ssh_sha512);
    ciphertext_00 = (uint16_t *)safemalloc(0x2f9,2,0);
    ntru_encrypt(ciphertext_00,(uint16_t *)peVar2->vt,pubkey_00,0x2f9,0x11ef);
    ntru_encode_ciphertext(ciphertext_00,0x2f9,0x11ef,(BinarySink *)&(dh[-3].vt)->getkey);
    ntru_confirmation_hash((uint8_t *)&ciphertext,(uint16_t *)peVar2->vt,pubkey_00,0x2f9,0x11ef);
    BinarySink_put_data((BinarySink *)&(dh[-2].vt)->getkey,&ciphertext,0x20);
    plaintext = peVar2->vt;
    ciphertext_01 = ptrlen_from_strbuf((strbuf *)dh[-3].vt);
    confirmation_hash = ptrlen_from_strbuf((strbuf *)dh[-2].vt);
    ntru_session_hash((uint8_t *)&ciphertext,1,(uint16_t *)plaintext,0x2f9,ciphertext_01,
                      confirmation_hash);
    BinarySink_put_data(*(BinarySink **)(hashdata._56_8_ + 8),&ciphertext,0x20);
    sb = strbuf_new_nm();
    src_1[0].binarysource_._7_1_ = ecdh_key_getkey((ecdh_key *)dh[-1].vt,pVar3,sb->binarysink_);
    if ((bool)src_1[0].binarysource_._7_1_) {
      pVar3 = ptrlen_from_strbuf(sb);
      BinarySource_INIT__((BinarySource *)local_138,pVar3);
      x = BinarySource_get_mp_ssh2((BinarySource *)src_1[0]._24_8_);
      local_154 = 0x20;
      while (local_154 != 0) {
        pBVar1 = *(BinarySink **)(hashdata._56_8_ + 8);
        val = mp_get_byte(x,(ulong)(local_154 - 1));
        BinarySink_put_byte(pBVar1,val);
        local_154 = local_154 - 1;
      }
      mp_free(x);
      strbuf_free(sb);
      ssh_hash_final((ssh_hash *)hashdata._56_8_,(uchar *)&ciphertext);
      pBVar1 = bs->binarysink_;
      pVar3 = make_ptrlen(&ciphertext,0x40);
      BinarySink_put_stringpl(pBVar1,pVar3);
      smemclr(&ciphertext,0x40);
      remoteKey_local.len._7_1_ = true;
    }
    else {
      ssh_hash_free((ssh_hash *)hashdata._56_8_);
      smemclr(&ciphertext,0x40);
      remoteKey_local.len._7_1_ = false;
    }
  }
  else {
    ring_free(pubkey_00,0x2f9);
    remoteKey_local.len._7_1_ = false;
  }
  return remoteKey_local.len._7_1_;
}

Assistant:

static bool ssh_ntru_server_getkey(ecdh_key *dh, ptrlen remoteKey,
                                   BinarySink *bs)
{
    ntru_server_key *nk = container_of(dh, ntru_server_key, ek);

    /*
     * In the server, getkey is called first, with the public
     * information received from the client. We expect the client to
     * have sent us a string containing a public key and a Curve25519
     * public point.
     */
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, remoteKey);

    uint16_t *pubkey = snewn(p_LIVE, uint16_t);
    ntru_decode_pubkey(pubkey, p_LIVE, q_LIVE, src);
    ptrlen curve25519_remoteKey = get_data(src, 32);

    if (get_err(src) || get_avail(src)) {
        /* Hard-fail if the input wasn't exactly the right length */ 
        ring_free(pubkey, p_LIVE);
        return false;
    }

    /*
     * Main hash object which will combine the NTRU and Curve25519
     * outputs.
     */
    ssh_hash *h = ssh_hash_new(&ssh_sha512);

    /* Reusable buffer for storing various hash outputs. */
    uint8_t hashdata[64];

    /*
     * NTRU side.
     */
    {
        /* Encrypt the plaintext we generated at construction time,
         * and encode the ciphertext into a strbuf so we can reuse it
         * for both the session hash and sending to the client. */
        uint16_t *ciphertext = snewn(p_LIVE, uint16_t);
        ntru_encrypt(ciphertext, nk->plaintext, pubkey, p_LIVE, q_LIVE);
        ntru_encode_ciphertext(ciphertext, p_LIVE, q_LIVE,
                               BinarySink_UPCAST(nk->ciphertext_encoded));

        /* Compute the confirmation hash, and write it into another
         * strbuf. */
        ntru_confirmation_hash(hashdata, nk->plaintext, pubkey,
                               p_LIVE, q_LIVE);
        put_data(nk->confirmation_hash, hashdata, 32);

        /* Compute the session hash (which is easy on the server side,
         * requiring no conditional substitution). */
        ntru_session_hash(hashdata, 1, nk->plaintext, p_LIVE,
                          ptrlen_from_strbuf(nk->ciphertext_encoded),
                          ptrlen_from_strbuf(nk->confirmation_hash));

        /* And put the NTRU session hash into the main hash object. */
        put_data(h, hashdata, 32);
    }

    /*
     * Curve25519 side.
     */
    {
        strbuf *otherkey = strbuf_new_nm();

        /* Call out to Curve25519 to compute the shared secret from that
         * kex method */
        bool ok = ecdh_key_getkey(nk->curve25519, curve25519_remoteKey,
                                  BinarySink_UPCAST(otherkey));
        /* As on the client side, abort if Curve25519 reported failure */
        if (!ok) {
            ssh_hash_free(h);
            smemclr(hashdata, sizeof(hashdata));
            return false;
        }

        /* As on the client side, decode Curve25519's mpint so we can
         * re-encode it appropriately for our hash preimage */
        BinarySource src[1];
        BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(otherkey));
        mp_int *curvekey = get_mp_ssh2(src);

        for (unsigned i = 32; i-- > 0 ;)
            put_byte(h, mp_get_byte(curvekey, i));

        mp_free(curvekey);
        strbuf_free(otherkey);
    }

    /*
     * Finish up: compute the final output hash (full 64 bytes of
     * SHA-512 this time), and return it encoded as a string.
     */
    ssh_hash_final(h, hashdata);
    put_stringpl(bs, make_ptrlen(hashdata, sizeof(hashdata)));
    smemclr(hashdata, sizeof(hashdata));

    return true;
}